

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

int __thiscall basist::approx_move_to_front::init(approx_move_to_front *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  basisu::vector<int>::resize(&this->m_values,(ulong)ctx & 0xffffffff,false);
  this->m_rover = (uint)((ulong)ctx >> 1) & 0x7fffffff;
  return extraout_EAX;
}

Assistant:

void init(uint32_t n)
		{
			m_values.resize(n);
			m_rover = n / 2;
		}